

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O3

void __thiscall google::protobuf::compiler::python::Generator::PrintTopLevelEnums(Generator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  Printer *pPVar3;
  char *pcVar4;
  long *plVar5;
  long lVar6;
  pointer ppVar7;
  FileDescriptor *pFVar8;
  ulong uVar9;
  long lVar10;
  EnumDescriptor *enum_descriptor;
  long lVar11;
  ulong uVar12;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  top_level_enum_values;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_80;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_58;
  long local_38;
  
  local_58.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pFVar8 = this->file_;
  if (0 < *(int *)(pFVar8 + 0x58)) {
    paVar1 = &local_80.first.field_2;
    lVar10 = 0;
    do {
      enum_descriptor = (EnumDescriptor *)(lVar10 * 0x38 + *(long *)(pFVar8 + 0x60));
      local_38 = lVar10;
      PrintEnum(this,enum_descriptor);
      pPVar3 = this->printer_;
      pcVar4 = *(char **)enum_descriptor;
      ModuleLevelDescriptorName<google::protobuf::EnumDescriptor>
                (&local_80.first,this,enum_descriptor);
      google::protobuf::io::Printer::Print
                ((char *)pPVar3,"$name$ = enum_type_wrapper.EnumTypeWrapper($descriptor_name$)",
                 (string *)0x16ceec,pcVar4,(string *)0x18606f);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.first._M_dataplus._M_p != paVar1) {
        operator_delete(local_80.first._M_dataplus._M_p,
                        local_80.first.field_2._M_allocated_capacity + 1);
      }
      google::protobuf::io::Printer::Print((char *)this->printer_);
      if (0 < *(int *)(enum_descriptor + 0x2c)) {
        lVar11 = 0x10;
        lVar10 = 0;
        do {
          plVar5 = *(long **)(*(long *)(enum_descriptor + 0x30) + -0x10 + lVar11);
          iVar2 = *(int *)(*(long *)(enum_descriptor + 0x30) + lVar11);
          lVar6 = *plVar5;
          local_80.first._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>((string *)&local_80,lVar6,plVar5[1] + lVar6);
          local_80.second = iVar2;
          std::
          vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
          ::emplace_back<std::pair<std::__cxx11::string,int>>
                    ((vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
                      *)&local_58,&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80.first._M_dataplus._M_p != paVar1) {
            operator_delete(local_80.first._M_dataplus._M_p,
                            local_80.first.field_2._M_allocated_capacity + 1);
          }
          lVar10 = lVar10 + 1;
          lVar11 = lVar11 + 0x28;
        } while (lVar10 < *(int *)(enum_descriptor + 0x2c));
      }
      lVar10 = local_38 + 1;
      pFVar8 = this->file_;
    } while (lVar10 < *(int *)(pFVar8 + 0x58));
    if (local_58.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_58.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar10 = 0;
      uVar12 = 0;
      do {
        ppVar7 = local_58.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pPVar3 = this->printer_;
        google::protobuf::SimpleItoa_abi_cxx11_((int)&local_80);
        google::protobuf::io::Printer::Print
                  ((char *)pPVar3,"$name$ = $value$\n",(string *)0x16ceec,
                   (char *)((long)&(ppVar7->first)._M_dataplus._M_p + lVar10),(string *)0x185c55);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80.first._M_dataplus._M_p != paVar1) {
          operator_delete(local_80.first._M_dataplus._M_p,
                          local_80.first.field_2._M_allocated_capacity + 1);
        }
        uVar12 = uVar12 + 1;
        uVar9 = ((long)local_58.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_58.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
        lVar10 = lVar10 + 0x28;
      } while (uVar12 <= uVar9 && uVar9 - uVar12 != 0);
    }
  }
  google::protobuf::io::Printer::Print((char *)this->printer_);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~vector(&local_58);
  return;
}

Assistant:

void Generator::PrintTopLevelEnums() const {
  vector<pair<string, int> > top_level_enum_values;
  for (int i = 0; i < file_->enum_type_count(); ++i) {
    const EnumDescriptor& enum_descriptor = *file_->enum_type(i);
    PrintEnum(enum_descriptor);
    printer_->Print("$name$ = "
                    "enum_type_wrapper.EnumTypeWrapper($descriptor_name$)",
                    "name", enum_descriptor.name(),
                    "descriptor_name",
                    ModuleLevelDescriptorName(enum_descriptor));
    printer_->Print("\n");

    for (int j = 0; j < enum_descriptor.value_count(); ++j) {
      const EnumValueDescriptor& value_descriptor = *enum_descriptor.value(j);
      top_level_enum_values.push_back(
          make_pair(value_descriptor.name(), value_descriptor.number()));
    }
  }

  for (int i = 0; i < top_level_enum_values.size(); ++i) {
    printer_->Print("$name$ = $value$\n",
                    "name", top_level_enum_values[i].first,
                    "value", SimpleItoa(top_level_enum_values[i].second));
  }
  printer_->Print("\n");
}